

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O0

MacroSymbol * __thiscall glslang::TPpContext::lookupMacroDef(TPpContext *this,int atom)

{
  bool bVar1;
  pointer ppVar2;
  MacroSymbol *local_38;
  _Self local_28;
  _Self local_20;
  iterator existingMacroIt;
  int atom_local;
  TPpContext *this_local;
  
  existingMacroIt._M_node._4_4_ = atom;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
       ::find(&(this->macroDefs).
               super_map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
              ,(key_type_conflict1 *)((long)&existingMacroIt._M_node + 4));
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
       ::end(&(this->macroDefs).
              super_map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
            );
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    local_38 = (MacroSymbol *)0x0;
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>::
             operator->(&local_20);
    local_38 = &ppVar2->second;
  }
  return local_38;
}

Assistant:

MacroSymbol* lookupMacroDef(int atom)
    {
        auto existingMacroIt = macroDefs.find(atom);
        return (existingMacroIt == macroDefs.end()) ? nullptr : &(existingMacroIt->second);
    }